

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxWriterDOTFormat.h
# Opt level: O0

void __thiscall psy::C::SyntaxWriterDOTFormat::~SyntaxWriterDOTFormat(SyntaxWriterDOTFormat *this)

{
  SyntaxWriterDOTFormat *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->terminalShapes_);
  std::
  stack<const_psy::C::SyntaxNode_*,_std::deque<const_psy::C::SyntaxNode_*,_std::allocator<const_psy::C::SyntaxNode_*>_>_>
  ::~stack(&this->nodes_);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&this->connections_);
  std::
  unordered_map<const_psy::C::SyntaxNode_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<const_psy::C::SyntaxNode_*>,_std::equal_to<const_psy::C::SyntaxNode_*>,_std::allocator<std::pair<const_psy::C::SyntaxNode_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map(&this->id_);
  SyntaxDumper::~SyntaxDumper(&this->super_SyntaxDumper);
  return;
}

Assistant:

class PSY_C_API SyntaxWriterDOTFormat final : public SyntaxDumper
{
public:
    using SyntaxDumper::SyntaxDumper;

    void write(const SyntaxNode* node, const std::string& fileSuffix);
    void write(const SyntaxNode* node, const std::string& fileSuffix, std::ostream& os);

private:
    static std::string name(const SyntaxNode* node);

    void terminal(const SyntaxToken& tk, const SyntaxNode* node) override;
    std::string terminalId(unsigned token);
    std::string terminalId(const SyntaxToken& tk);

    void generateTokens();
    void alignTerminals();
    void nodeLabel(const SyntaxNode* node);

    bool preVisit(const SyntaxNode* node) override;
    void postVisit(const SyntaxNode*) override;

    std::unordered_map<const SyntaxNode*, std::string> id_;
    std::vector<std::pair<std::string, std::string>> connections_;
    std::stack<const SyntaxNode*> nodes_;
    std::vector<std::string> terminalShapes_;
    std::ostream* os_;
    int count_;
}